

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# seg_helper.c
# Opt level: O1

void helper_ljmp_protected_x86_64
               (CPUX86State *env,int new_cs,target_ulong new_eip,target_ulong next_eip)

{
  bool bVar1;
  uint32_t uVar2;
  ulong uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  abi_ptr aVar13;
  uint uVar14;
  uintptr_t unaff_retaddr;
  uint32_t local_50;
  
  uVar4 = new_cs & 0xfffc;
  if (uVar4 == 0) {
LAB_0051f676:
    raise_exception_err_ra_x86_64(env,0xd,0,unaff_retaddr);
  }
  uVar3 = 0x178;
  lVar9 = 0x148;
  if ((new_cs & 4U) == 0) {
    lVar9 = 0x178;
  }
  uVar11 = *(uint *)((long)env->regs + lVar9 + 0x10);
  if ((new_cs | 7U) <= uVar11) {
    uVar14 = 2;
    uVar5 = 2;
    aVar13 = (long)(int)(new_cs & 0xfffffff8) + *(long *)((long)env->regs + lVar9 + 8);
    if (((env->hflags >> 0x17 & 1) != 0) && (uVar5 = 0, (~env->hflags & 3) != 0)) {
      uVar5 = (uint)env->eflags >> 0x11 & 2;
    }
    local_50 = cpu_ldl_mmuidx_ra_x86_64(env,aVar13,uVar5,unaff_retaddr);
    if (((env->hflags >> 0x17 & 1) != 0) && (uVar14 = 0, (~env->hflags & 3) != 0)) {
      uVar14 = (uint)env->eflags >> 0x11 & 2;
    }
    uVar2 = cpu_ldl_mmuidx_ra_x86_64(env,aVar13 + 4,uVar14,unaff_retaddr);
    uVar3 = (ulong)uVar2;
  }
  uVar5 = (uint)uVar3;
  if ((new_cs | 7U) <= uVar11) {
    uVar11 = env->hflags;
    uVar14 = uVar11 & 3;
    if ((uVar5 >> 0xc & 1) == 0) {
      uVar8 = (uint)(uVar3 >> 8) & 0xf;
      uVar6 = (uint)env->efer;
      if ((uVar8 == 0xc || (uVar6 >> 10 & 1) == 0) && (uVar8 < 0xd)) {
        uVar10 = (uint)(uVar3 >> 0xd) & 3;
        if ((0x222U >> uVar8 & 1) == 0) {
          if ((((0x1010U >> uVar8 & 1) != 0) && ((new_cs & 3U) <= uVar10)) && (uVar14 <= uVar10)) {
            if ((short)uVar3 < 0) {
              uVar10 = 0;
              if (uVar8 == 0xc) {
                uVar10 = uVar5 & 0xffff0000;
              }
              uVar10 = uVar10 | local_50 & 0xffff;
              uVar12 = (ulong)uVar10;
              uVar8 = local_50;
              if ((uVar6 >> 10 & 1) != 0) {
                lVar9 = 0x148;
                if ((new_cs & 4U) == 0) {
                  lVar9 = 0x178;
                }
                uVar7 = new_cs + 8U | 7;
                uVar6 = *(uint *)((long)env->regs + lVar9 + 0x10);
                if (uVar7 <= uVar6) {
                  uVar5 = 2;
                  aVar13 = (long)(int)(new_cs + 8U & 0xfffffff8) +
                           *(long *)((long)env->regs + lVar9 + 8);
                  if (((uVar11 >> 0x17 & 1) != 0) && (uVar5 = 0, uVar14 != 3)) {
                    uVar5 = (uint)env->eflags >> 0x11 & 2;
                  }
                  uVar8 = cpu_ldl_mmuidx_ra_x86_64(env,aVar13,uVar5,unaff_retaddr);
                  uVar11 = 2;
                  if (((env->hflags >> 0x17 & 1) != 0) && (uVar11 = 0, (~env->hflags & 3) != 0)) {
                    uVar11 = (uint)env->eflags >> 0x11 & 2;
                  }
                  uVar2 = cpu_ldl_mmuidx_ra_x86_64(env,aVar13 + 4,uVar11,unaff_retaddr);
                  uVar3 = (ulong)uVar2;
                }
                uVar5 = (uint)uVar3;
                if ((uVar6 < uVar7) || ((uVar3 & 0x1f00) != 0)) goto LAB_0051f669;
                uVar12 = CONCAT44(uVar8,uVar10);
              }
              uVar4 = local_50 >> 0x10;
              lVar9 = 0x148;
              if ((local_50 >> 0x12 & 1) == 0) {
                lVar9 = 0x178;
              }
              uVar11 = *(uint *)((long)env->regs + lVar9 + 0x10);
              if ((uVar4 | 7) <= uVar11) {
                uVar5 = 2;
                aVar13 = (ulong)(uVar4 & 0xfffffff8) + *(long *)((long)env->regs + lVar9 + 8);
                if (((env->hflags >> 0x17 & 1) != 0) && (uVar5 = 0, (~env->hflags & 3) != 0)) {
                  uVar5 = (uint)env->eflags >> 0x11 & 2;
                }
                uVar8 = cpu_ldl_mmuidx_ra_x86_64(env,aVar13,uVar5,unaff_retaddr);
                uVar5 = 2;
                if (((env->hflags >> 0x17 & 1) != 0) && (uVar5 = 0, (~env->hflags & 3) != 0)) {
                  uVar5 = (uint)env->eflags >> 0x11 & 2;
                }
                uVar5 = cpu_ldl_mmuidx_ra_x86_64(env,aVar13 + 4,uVar5,unaff_retaddr);
              }
              if (((uVar4 | 7) <= uVar11) && ((~uVar5 & 0x1800) == 0)) {
                uVar11 = uVar5 >> 0xd & 3;
                bVar1 = uVar11 <= uVar14;
                if ((uVar5 >> 10 & 1) == 0) {
                  bVar1 = uVar11 == uVar14;
                }
                if ((bVar1) &&
                   ((((env->efer & 0x400) == 0 ||
                     (((uVar5 >> 0x15 & 1) != 0 && ((uVar5 >> 0x16 & 1) == 0)))) &&
                    ((short)uVar5 < 0)))) {
                  uVar6 = uVar5 & 0xf0000 | uVar8 & 0xffff;
                  uVar11 = uVar6 << 0xc | 0xfff;
                  if ((uVar5 >> 0x17 & 1) == 0) {
                    uVar11 = uVar6;
                  }
                  if ((uVar12 <= uVar11) ||
                     (((env->hflags & 0x4000) != 0 && ((uVar5 & 0x200000) != 0)))) {
                    env->segs[1].selector = uVar14 | uVar4 & 0xfffffffc;
                    env->segs[1].base =
                         (ulong)(uVar5 & 0xff000000 | uVar8 >> 0x10 | (uVar5 & 0xff) << 0x10);
                    env->segs[1].limit = uVar11;
                    env->segs[1].flags = uVar5;
                    uVar4 = env->hflags;
                    if ((uVar5 >> 0x15 & 1) == 0 || (uVar4 >> 0xe & 1) == 0) {
                      uVar4 = uVar4 & 0xffff7fef | env->segs[1].flags >> 0x12 & 0x10;
                    }
                    else {
                      uVar4 = uVar4 & 0xffff7f8f | 0x8030;
                    }
                    env->hflags = uVar4;
                    uVar11 = env->segs[2].flags >> 0x11 & 0x20;
                    if (-1 < (short)uVar4) {
                      if ((((env->cr[0] & 1) == 0) || ((uVar4 & 0x10) == 0)) ||
                         ((env->eflags & 0x20000) != 0)) {
                        uVar11 = uVar11 | 0x40;
                      }
                      else {
                        uVar11 = uVar11 | (uint)((env->segs[0].base != 0 || env->segs[3].base != 0)
                                                || env->segs[2].base != 0) << 6;
                      }
                    }
                    env->hflags = uVar4 & 0xffffff9f | uVar11;
                    env->eip = uVar12;
                    return;
                  }
                  goto LAB_0051f676;
                }
              }
              raise_exception_err_ra_x86_64(env,0xd,uVar4 & 0xfffffffc,unaff_retaddr);
            }
            goto LAB_0051f699;
          }
        }
        else if (((new_cs & 3U) <= uVar10) && (uVar14 <= uVar10)) {
          switch_tss_ra(env,new_cs,local_50,uVar5,0,(uint32_t)next_eip,unaff_retaddr);
          return;
        }
      }
    }
    else if ((uVar5 >> 0xb & 1) != 0) {
      uVar8 = (uint)(uVar3 >> 0xd) & 3;
      if ((uVar5 >> 10 & 1) == 0) {
        if ((uVar14 < (new_cs & 3U)) || (uVar8 != uVar14)) goto LAB_0051f669;
      }
      else if (uVar14 < uVar8) goto LAB_0051f669;
      if (-1 < (short)uVar3) {
LAB_0051f699:
        raise_exception_err_ra_x86_64(env,0xb,uVar4,unaff_retaddr);
      }
      uVar6 = uVar5 & 0xf0000 | local_50 & 0xffff;
      uVar8 = uVar6 << 0xc | 0xfff;
      if ((uVar5 >> 0x17 & 1) == 0) {
        uVar8 = uVar6;
      }
      if ((new_eip <= uVar8) || (((uVar11 >> 0xe & 1) != 0 && ((uVar3 & 0x200000) != 0)))) {
        env->segs[1].selector = uVar14 | uVar4;
        env->segs[1].base = (ulong)(uVar5 & 0xff000000 | local_50 >> 0x10 | (uVar5 & 0xff) << 0x10);
        env->segs[1].limit = uVar8;
        env->segs[1].flags = uVar5;
        if ((uVar5 >> 0x15 & 1) == 0 || (uVar11 >> 0xe & 1) == 0) {
          uVar4 = uVar11 & 0xffff7fef | env->segs[1].flags >> 0x12 & 0x10;
        }
        else {
          uVar4 = uVar11 & 0xffff7f8f | 0x8030;
        }
        env->hflags = uVar4;
        uVar11 = env->segs[2].flags >> 0x11 & 0x20;
        if (-1 < (short)uVar4) {
          if ((((env->cr[0] & 1) == 0) || ((uVar4 & 0x10) == 0)) || ((env->eflags & 0x20000) != 0))
          {
            uVar11 = uVar11 | 0x40;
          }
          else {
            uVar11 = uVar11 | (uint)((env->segs[0].base != 0 || env->segs[3].base != 0) ||
                                    env->segs[2].base != 0) << 6;
          }
        }
        env->hflags = uVar4 & 0xffffff9f | uVar11;
        env->eip = new_eip;
        return;
      }
      goto LAB_0051f676;
    }
  }
LAB_0051f669:
  raise_exception_err_ra_x86_64(env,0xd,uVar4,unaff_retaddr);
}

Assistant:

void helper_ljmp_protected(CPUX86State *env, int new_cs, target_ulong new_eip,
                           target_ulong next_eip)
{
    int gate_cs, type;
    uint32_t e1, e2, cpl, dpl, rpl, limit;

    if ((new_cs & 0xfffc) == 0) {
        raise_exception_err_ra(env, EXCP0D_GPF, 0, GETPC());
    }
    if (load_segment_ra(env, &e1, &e2, new_cs, GETPC()) != 0) {
        raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
    }
    cpl = env->hflags & HF_CPL_MASK;
    if (e2 & DESC_S_MASK) {
        if (!(e2 & DESC_CS_MASK)) {
            raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
        }
        dpl = (e2 >> DESC_DPL_SHIFT) & 3;
        if (e2 & DESC_C_MASK) {
            /* conforming code segment */
            if (dpl > cpl) {
                raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
            }
        } else {
            /* non conforming code segment */
            rpl = new_cs & 3;
            if (rpl > cpl) {
                raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
            }
            if (dpl != cpl) {
                raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
            }
        }
        if (!(e2 & DESC_P_MASK)) {
            raise_exception_err_ra(env, EXCP0B_NOSEG, new_cs & 0xfffc, GETPC());
        }
        limit = get_seg_limit(e1, e2);
        if (new_eip > limit &&
            (!(env->hflags & HF_LMA_MASK) || !(e2 & DESC_L_MASK))) {
            raise_exception_err_ra(env, EXCP0D_GPF, 0, GETPC());
        }
        cpu_x86_load_seg_cache(env, R_CS, (new_cs & 0xfffc) | cpl,
                       get_seg_base(e1, e2), limit, e2);
        env->eip = new_eip;
    } else {
        /* jump to call or task gate */
        dpl = (e2 >> DESC_DPL_SHIFT) & 3;
        rpl = new_cs & 3;
        cpl = env->hflags & HF_CPL_MASK;
        type = (e2 >> DESC_TYPE_SHIFT) & 0xf;

#ifdef TARGET_X86_64
        if (env->efer & MSR_EFER_LMA) {
            if (type != 12) {
                raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
            }
        }
#endif
        switch (type) {
        case 1: /* 286 TSS */
        case 9: /* 386 TSS */
        case 5: /* task gate */
            if (dpl < cpl || dpl < rpl) {
                raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
            }
            switch_tss_ra(env, new_cs, e1, e2, SWITCH_TSS_JMP, next_eip, GETPC());
            break;
        case 4: /* 286 call gate */
        case 12: /* 386 call gate */
            if ((dpl < cpl) || (dpl < rpl)) {
                raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
            }
            if (!(e2 & DESC_P_MASK)) {
                raise_exception_err_ra(env, EXCP0B_NOSEG, new_cs & 0xfffc, GETPC());
            }
            gate_cs = e1 >> 16;
            new_eip = (e1 & 0xffff);
            if (type == 12) {
                new_eip |= (e2 & 0xffff0000);
            }

#ifdef TARGET_X86_64
            if (env->efer & MSR_EFER_LMA) {
                /* load the upper 8 bytes of the 64-bit call gate */
                if (load_segment_ra(env, &e1, &e2, new_cs + 8, GETPC())) {
                    raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc,
                                           GETPC());
                }
                type = (e2 >> DESC_TYPE_SHIFT) & 0x1f;
                if (type != 0) {
                    raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc,
                                           GETPC());
                }
                new_eip |= ((target_ulong)e1) << 32;
            }
#endif

            if (load_segment_ra(env, &e1, &e2, gate_cs, GETPC()) != 0) {
                raise_exception_err_ra(env, EXCP0D_GPF, gate_cs & 0xfffc, GETPC());
            }
            dpl = (e2 >> DESC_DPL_SHIFT) & 3;
            /* must be code segment */
            if (((e2 & (DESC_S_MASK | DESC_CS_MASK)) !=
                 (DESC_S_MASK | DESC_CS_MASK))) {
                raise_exception_err_ra(env, EXCP0D_GPF, gate_cs & 0xfffc, GETPC());
            }
            if (((e2 & DESC_C_MASK) && (dpl > cpl)) ||
                (!(e2 & DESC_C_MASK) && (dpl != cpl))) {
                raise_exception_err_ra(env, EXCP0D_GPF, gate_cs & 0xfffc, GETPC());
            }
#ifdef TARGET_X86_64
            if (env->efer & MSR_EFER_LMA) {
                if (!(e2 & DESC_L_MASK)) {
                    raise_exception_err_ra(env, EXCP0D_GPF, gate_cs & 0xfffc, GETPC());
                }
                if (e2 & DESC_B_MASK) {
                    raise_exception_err_ra(env, EXCP0D_GPF, gate_cs & 0xfffc, GETPC());
                }
            }
#endif
            if (!(e2 & DESC_P_MASK)) {
                raise_exception_err_ra(env, EXCP0D_GPF, gate_cs & 0xfffc, GETPC());
            }
            limit = get_seg_limit(e1, e2);
            if (new_eip > limit &&
                (!(env->hflags & HF_LMA_MASK) || !(e2 & DESC_L_MASK))) {
                raise_exception_err_ra(env, EXCP0D_GPF, 0, GETPC());
            }
            cpu_x86_load_seg_cache(env, R_CS, (gate_cs & 0xfffc) | cpl,
                                   get_seg_base(e1, e2), limit, e2);
            env->eip = new_eip;
            break;
        default:
            raise_exception_err_ra(env, EXCP0D_GPF, new_cs & 0xfffc, GETPC());
            break;
        }
    }
}